

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

DynamicObject * __thiscall
Js::JavascriptLibrary::CreateObject
          (JavascriptLibrary *this,bool allowObjectHeaderInlining,
          PropertyIndex requestedInlineSlotCapacity)

{
  code *pcVar1;
  bool bVar2;
  DynamicType *pDVar3;
  undefined4 *puVar4;
  Recycler *recycler;
  DynamicObject *pDVar5;
  DynamicType *local_38;
  bool local_29;
  DynamicType *type;
  bool useObjectHeaderInlining;
  PropertyIndex requestedInlineSlotCapacity_local;
  bool allowObjectHeaderInlining_local;
  JavascriptLibrary *this_local;
  
  pDVar3 = GetObjectType(this);
  if (pDVar3 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a6d,"(GetObjectType())","GetObjectType()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pDVar3 = GetObjectHeaderInlinedType(this);
  if (pDVar3 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a6e,"(GetObjectHeaderInlinedType())",
                                "GetObjectHeaderInlinedType()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_29 = false;
  if (allowObjectHeaderInlining) {
    local_29 = FunctionBody::DoObjectHeaderInliningForObjectLiteral
                         ((uint)requestedInlineSlotCapacity);
  }
  if (local_29 == false) {
    local_38 = GetObjectLiteralType(this,requestedInlineSlotCapacity);
  }
  else {
    local_38 = GetObjectHeaderInlinedLiteralType(this,requestedInlineSlotCapacity);
  }
  recycler = GetRecycler(this);
  pDVar5 = DynamicObject::New(recycler,local_38);
  return pDVar5;
}

Assistant:

DynamicObject* JavascriptLibrary::CreateObject(
        const bool allowObjectHeaderInlining,
        const PropertyIndex requestedInlineSlotCapacity)
    {
        Assert(GetObjectType());
        Assert(GetObjectHeaderInlinedType());

        const bool useObjectHeaderInlining =
            allowObjectHeaderInlining && FunctionBody::DoObjectHeaderInliningForObjectLiteral(requestedInlineSlotCapacity);
        DynamicType *const type =
            useObjectHeaderInlining
            ? GetObjectHeaderInlinedLiteralType(requestedInlineSlotCapacity)
            : GetObjectLiteralType(requestedInlineSlotCapacity);
        return DynamicObject::New(GetRecycler(), type);
    }